

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

ErrorPolicy llvm::DWARFContext::defaultErrorHandler(Error *E)

{
  char *__n;
  raw_ostream *prVar1;
  size_t __n_00;
  Error *E_00;
  void *__buf;
  string local_40;
  ulong local_20;
  
  prVar1 = WithColor::error();
  __n_00 = (ulong)E->Payload | 1;
  E->Payload = (ErrorInfoBase *)0x0;
  local_20 = __n_00;
  toString_abi_cxx11_(&local_40,(llvm *)&local_20,E_00);
  prVar1 = (raw_ostream *)
           raw_ostream::write(prVar1,(int)local_40._M_dataplus._M_p,
                              (void *)local_40._M_string_length,__n_00);
  __n = prVar1->OutBufCur;
  if (__n < prVar1->OutBufEnd) {
    prVar1->OutBufCur = __n + 1;
    *__n = '\n';
  }
  else {
    raw_ostream::write(prVar1,10,__buf,(size_t)__n);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((long *)(local_20 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(local_20 & 0xfffffffffffffffe) + 8))();
  }
  return Continue;
}

Assistant:

ErrorPolicy DWARFContext::defaultErrorHandler(Error E) {
  WithColor::error() << toString(std::move(E)) << '\n';
  return ErrorPolicy::Continue;
}